

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPXBelief::Update(POMDPXBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  POMDPX *pPVar1;
  State *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  log_ostream *plVar5;
  ostream *poVar6;
  pointer ppSVar7;
  long lVar8;
  DSPOMDP *model;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar13;
  ulong uVar14;
  double dVar15;
  vector<despot::State_*,_std::allocator<despot::State_*>_> updated;
  State *copy;
  OBS_TYPE o;
  double reward;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_98;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  double local_60;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_58;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_60 = (double)obs;
  History::Add(&(this->super_ParticleBelief).super_Belief.history_,action,obs);
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (State **)0x0;
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (State **)0x0;
  if (0 < this->max_iter_) {
    iVar11 = 0;
    do {
      ppSVar7 = (this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->super_ParticleBelief).particles_.
          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppSVar7) {
        uVar10 = 0;
        do {
          iVar4 = (*(this->model_->super_MDP)._vptr_MDP[0x1a])(this->model_,ppSVar7[uVar10]);
          pPVar1 = this->model_;
          local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar4);
          dVar13 = Random::NextDouble((Random *)&Random::RANDOM);
          iVar4 = (*(pPVar1->super_MDP)._vptr_MDP[8])
                            (SUB84(dVar13,0),pPVar1,(State *)CONCAT44(extraout_var,iVar4),action,
                             local_38,local_40);
          (*(this->model_->super_MDP)._vptr_MDP[0xc])
                    (this->model_,local_60,
                     local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,action);
          if ((char)iVar4 == '\0' && (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.0) {
            *(double *)
             ((long)local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x18) =
                 (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) *
                 *(double *)
                  ((long)local_78.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + 0x18);
            if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<despot::State*,std::allocator<despot::State*>>::
              _M_realloc_insert<despot::State*const&>
                        ((vector<despot::State*,std::allocator<despot::State*>> *)&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(State **)&local_78);
            }
            else {
              *local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
               _M_impl.super__Vector_impl_data._M_finish =
                   (State *)local_78.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
              .super__Vector_impl_data._M_finish =
                   local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            (*(this->model_->super_MDP)._vptr_MDP[0x1b])
                      (this->model_,
                       local_78.
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
                       .super__Vector_impl_data._M_start);
          }
          if ((long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
              (long)(this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_start) break;
          uVar10 = uVar10 + 1;
          ppSVar7 = (this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)(this->super_ParticleBelief).particles_.
                                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7
                                 >> 3));
      }
      if ((long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
          (long)(this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start) {
        iVar4 = logging::level();
        if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
          plVar5 = logging::stream(3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar5->super_ostream,"[POMDPXBelief::Update] ",0x17);
          poVar6 = (ostream *)std::ostream::operator<<(plVar5,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," iterations for normal simulations",0x22);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        break;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < this->max_iter_);
  }
  if (((long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start !=
       (long)(this->super_ParticleBelief).particles_.
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->super_ParticleBelief).particles_.
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start) && (-1 < this->max_iter_)) {
    iVar11 = 0;
    do {
      ppSVar7 = (this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->super_ParticleBelief).particles_.
          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppSVar7) {
        uVar10 = 0;
        do {
          iVar4 = (*(this->model_->super_MDP)._vptr_MDP[0x1a])(this->model_,ppSVar7[uVar10]);
          pPVar1 = this->model_;
          local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar4);
          dVar13 = Random::NextDouble((Random *)&Random::RANDOM);
          bVar3 = POMDPX::NoisyStep(pPVar1,(State *)CONCAT44(extraout_var_00,iVar4),dVar13,action);
          (*(this->model_->super_MDP)._vptr_MDP[0xc])
                    (this->model_,local_60,
                     local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,action);
          uVar14 = 0x3eb0c6f7a0b5ed8d;
          if (iVar11 != this->max_iter_) {
            uVar14 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
          }
          uVar12 = -(ulong)((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) < 1e-06);
          dVar13 = (double)(~uVar12 & CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) |
                           uVar14 & uVar12);
          if (bVar3 || dVar13 == 0.0) {
            (*(this->model_->super_MDP)._vptr_MDP[0x1b])
                      (this->model_,
                       local_78.
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
                       .super__Vector_impl_data._M_start);
          }
          else {
            *(double *)
             ((long)local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x18) =
                 dVar13 * *(double *)
                           ((long)local_78.
                                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0x18);
            if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<despot::State*,std::allocator<despot::State*>>::
              _M_realloc_insert<despot::State*const&>
                        ((vector<despot::State*,std::allocator<despot::State*>> *)&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(State **)&local_78);
            }
            else {
              *local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
               _M_impl.super__Vector_impl_data._M_finish =
                   (State *)local_78.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
              .super__Vector_impl_data._M_finish =
                   local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          if ((long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
              (long)(this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_start) break;
          uVar10 = uVar10 + 1;
          ppSVar7 = (this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)(this->super_ParticleBelief).particles_.
                                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7
                                 >> 3));
      }
      if ((long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
          (long)(this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start) {
        iVar4 = logging::level();
        if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
          plVar5 = logging::stream(3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar5->super_ostream,"[POMDPXBelief::Update] ",0x17);
          poVar6 = (ostream *)std::ostream::operator<<(plVar5,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," iterations for noisy simulations",0x21);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        break;
      }
      bVar3 = iVar11 < this->max_iter_;
      iVar11 = iVar11 + 1;
    } while (bVar3);
  }
  ppSVar7 = (this->super_ParticleBelief).particles_.
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->super_ParticleBelief).particles_.
      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar7) {
    uVar10 = 0;
    do {
      (*(this->model_->super_MDP)._vptr_MDP[0x1b])(this->model_,ppSVar7[uVar10]);
      uVar10 = uVar10 + 1;
      ppSVar7 = (this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->super_ParticleBelief).particles_.
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3)
            );
  }
  this_00 = &(this->super_ParticleBelief).particles_;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=(this_00,&local_98);
  dVar13 = State::Weight(this_00);
  ppSVar7 = (this->super_ParticleBelief).particles_.
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar8 = (long)(this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppSVar7;
  if (lVar8 == 0) {
    local_60 = 0.0;
  }
  else {
    lVar8 = lVar8 >> 3;
    local_60 = 0.0;
    lVar9 = 0;
    do {
      pSVar2 = ppSVar7[lVar9];
      dVar15 = pSVar2->weight / dVar13;
      pSVar2->weight = dVar15;
      local_60 = local_60 + dVar15 * dVar15;
      lVar9 = lVar9 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
  }
  local_60 = 1.0 / local_60;
  if (local_60 < (double)(this->super_ParticleBelief).num_particles_ / 20.0) {
    iVar11 = logging::level();
    if ((0 < iVar11) && (iVar11 = logging::level(), 2 < iVar11)) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,"[POMDPXBelief::Update] Resampling ",0x22);
      poVar6 = (ostream *)
               std::ostream::operator<<(plVar5,(this->super_ParticleBelief).num_particles_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," as effective number of particles = ",0x24);
      poVar6 = std::ostream::_M_insert<double>(local_60);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    iVar11 = (this->super_ParticleBelief).num_particles_;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_58,this_00);
    model = &this->model_->super_DSPOMDP;
    if (this->model_ == (POMDPX *)0x0) {
      model = (DSPOMDP *)0x0;
    }
    ParticleBelief::Sample(&local_78,iVar11,&local_58,model);
    if (local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ppSVar7 = (this->super_ParticleBelief).particles_.
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->super_ParticleBelief).particles_.
        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppSVar7) {
      uVar10 = 0;
      do {
        (*(this->model_->super_MDP)._vptr_MDP[0x1b])(this->model_,ppSVar7[uVar10]);
        uVar10 = uVar10 + 1;
        ppSVar7 = (this->super_ParticleBelief).particles_.
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar10 < (ulong)((long)(this->super_ParticleBelief).particles_.
                                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >>
                               3));
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=(this_00,&local_78);
    if ((State *)local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                 _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
      operator_delete(local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Update(ACT_TYPE action, OBS_TYPE obs) {
		history_.Add(action, obs);

		vector<State*> updated;
		double reward;
		OBS_TYPE o;

		// Update particles by looping through the particles for multiple iterations
		for (int i = 0; i < max_iter_; i++) {
			for (int j = 0; j < particles_.size(); j++) {
				State* particle = particles_[j];
				State* copy = model_->Copy(particle);

				bool terminal = model_->Step(*copy, Random::RANDOM.NextDouble(),
					action, reward, o);
				double prob = model_->ObsProb(obs, *copy, action);

				if (!terminal && prob) { // Terminal state is not required to be explicitly represented and may not have any observation
					copy->weight *= prob;
					updated.push_back(copy);
				} else {
					model_->Free(copy);
				}

				if (updated.size() == particles_.size())
					break;
			}
			if (updated.size() == particles_.size()) {
				logi << "[POMDPXBelief::Update] " << i
					<< " iterations for normal simulations" << endl;
				break;
			}
		}

		// Perform at most max_iter_ noisy iterations to generate particles, or keep
		// inconsistent particles after that
		if (updated.size() != particles_.size()) {
			for (int i = 0; i < max_iter_ + 1; i++) {
				for (int j = 0; j < particles_.size(); j++) {
					State* particle = particles_[j];
					State* copy = model_->Copy(particle);

					bool terminal = model_->NoisyStep(*copy,
						Random::RANDOM.NextDouble(), action);
					double prob = model_->ObsProb(obs, *copy, action);

					if (i == max_iter_ && prob < 1E-6) // NOTE: never kill a particle at the last iteration
						prob = 1E-6;

					if (!terminal && prob) {
						copy->weight *= prob;
						updated.push_back(copy);
					} else {
						model_->Free(copy);
					}

					if (updated.size() == particles_.size())
						break;
				}
				if (updated.size() == particles_.size()) {
					logi << "[POMDPXBelief::Update] " << i
						<< " iterations for noisy simulations" << endl;
					break;
				}
			}
		}

		for (int i = 0; i < particles_.size(); i++)
			model_->Free(particles_[i]);

		particles_ = updated;

		double total_weight = State::Weight(particles_);
		double weight_square_sum = 0;
		for (int i = 0; i < particles_.size(); i++) {
			State* particle = particles_[i];
			particle->weight /= total_weight;
			weight_square_sum += particle->weight * particle->weight;
		}

		// Resample if the effective number of particles is "small"
		double num_effective_particles = 1.0 / weight_square_sum;
		if (num_effective_particles < num_particles_ / 20.0) { // NOTE: small particles may be removed...
			logi << "[POMDPXBelief::Update] Resampling " << num_particles_
				<< " as effective number of particles = "
				<< num_effective_particles << endl;
			vector<State*> new_belief = ParticleBelief::Sample(num_particles_,
				particles_, model_);
			for (int i = 0; i < particles_.size(); i++)
				model_->Free(particles_[i]);

			particles_ = new_belief;
		}
	}